

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * CheckPlannerType_abi_cxx11_(string *__return_storage_ptr__,int numOptions,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  char *__s;
  
  if (0 < numOptions) {
    uVar4 = 1;
    do {
      pcVar3 = argv[uVar4];
      iVar1 = strncmp("--planner=",pcVar3,10);
      if (iVar1 == 0) {
        __s = pcVar3 + 10;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        sVar2 = strlen(__s);
        pcVar3 = pcVar3 + sVar2 + 10;
        goto LAB_00105dd9;
      }
      uVar4 = uVar4 + 1;
    } while (numOptions + 1 != uVar4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __s = "arastar";
  pcVar3 = "";
LAB_00105dd9:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string CheckPlannerType(int numOptions, char** argv)
{
    int optionLength = strlen("--planner=");
    for (int i = 1; i < numOptions + 1; i++) {
        if (strncmp("--planner=", argv[i], optionLength) == 0) {
            std::string s(&argv[i][optionLength]);
            return s;
        }
    }
    return std::string("arastar");
}